

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFileArtifactResultGetter<ArtifactImportFilePrefixTag>::Get_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFileArtifactResultGetter<ArtifactImportFilePrefixTag> *this,
          cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *param_3)

{
  bool bVar1;
  GeneratorExpressionContent *param_2_local;
  cmGeneratorExpressionContext *context_local;
  cmGeneratorTarget *target_local;
  
  bVar1 = cmGeneratorTarget::HasImportLibrary
                    ((cmGeneratorTarget *)this,
                     (string *)&(target->LinkOptionsCache)._M_t._M_impl.super__Rb_tree_header);
  if (bVar1) {
    cmGeneratorTarget::GetFilePrefix
              (__return_storage_ptr__,(cmGeneratorTarget *)this,
               (string *)&(target->LinkOptionsCache)._M_t._M_impl.super__Rb_tree_header,
               ImportLibraryArtifact);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Get(cmGeneratorTarget* target,
                         cmGeneratorExpressionContext* context,
                         const GeneratorExpressionContent*)
  {
    if (target->HasImportLibrary(context->Config)) {
      return target->GetFilePrefix(context->Config,
                                   cmStateEnums::ImportLibraryArtifact);
    }
    return std::string{};
  }